

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

StructElement * __thiscall
soul::HEARTGenerator::createStructSubElement
          (HEARTGenerator *this,StructMemberRef *member,Expression *source)

{
  StructElement *pSVar1;
  string local_40;
  Expression *local_20;
  Expression *source_local;
  StructMemberRef *member_local;
  HEARTGenerator *this_local;
  
  local_20 = source;
  source_local = (Expression *)member;
  member_local = (StructMemberRef *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)&member->memberName);
  pSVar1 = BlockBuilder::createStructElement(&(this->builder).super_BlockBuilder,source,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return pSVar1;
}

Assistant:

heart::StructElement& createStructSubElement (AST::StructMemberRef& member, heart::Expression& source)
    {
        return builder.createStructElement (source, member.memberName);
    }